

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrgif.c
# Opt level: O3

void flush_packet(gif_dest_ptr dinfo)

{
  uint uVar1;
  j_decompress_ptr pjVar2;
  jpeg_error_mgr *pjVar3;
  size_t sVar4;
  
  uVar1 = dinfo->bytesinpkt;
  if (0 < (int)uVar1) {
    dinfo->bytesinpkt = (int)((ulong)uVar1 + 1);
    dinfo->packetbuf[0] = (char)uVar1;
    sVar4 = fwrite(dinfo->packetbuf,1,(ulong)uVar1 + 1,(FILE *)(dinfo->pub).output_file);
    if (sVar4 != (long)dinfo->bytesinpkt) {
      pjVar2 = dinfo->cinfo;
      pjVar3 = pjVar2->err;
      pjVar3->msg_code = 0x25;
      (*pjVar3->error_exit)((j_common_ptr)pjVar2);
    }
    dinfo->bytesinpkt = 0;
  }
  return;
}

Assistant:

LOCAL(void)
flush_packet(gif_dest_ptr dinfo)
/* flush any accumulated data */
{
  if (dinfo->bytesinpkt > 0) {  /* never write zero-length packet */
    dinfo->packetbuf[0] = (char)dinfo->bytesinpkt++;
    if (JFWRITE(dinfo->pub.output_file, dinfo->packetbuf, dinfo->bytesinpkt) !=
        (size_t)dinfo->bytesinpkt)
      ERREXIT(dinfo->cinfo, JERR_FILE_WRITE);
    dinfo->bytesinpkt = 0;
  }
}